

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O2

void __thiscall OpenMD::Electrostatic::addType(Electrostatic *this,AtomType *atomType)

{
  int iVar1;
  double dVar2;
  size_t sVar3;
  size_t sVar4;
  RealType a;
  int n;
  RealType b;
  bool bVar5;
  int iVar6;
  long lVar7;
  _Rb_tree_node_base *p_Var8;
  int i;
  int iVar9;
  int iVar10;
  long lVar11;
  RealType RVar12;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar13;
  int atid;
  MultipoleAdapter ma;
  RealType rval;
  CubicSplinePtr J;
  double local_1a0;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  vector<double,_std::allocator<double>_> Jvals;
  vector<double,_std::allocator<double>_> rvals;
  ElectrostaticAtomData local_150;
  ElectrostaticAtomData eaData2;
  
  ElectrostaticAtomData::ElectrostaticAtomData(&local_150);
  local_150.is_Charge = false;
  local_150.is_Dipole = false;
  local_150.is_Quadrupole = false;
  local_150.is_Fluctuating = false;
  local_150.uses_SlaterIntramolecular = false;
  fca.at_ = atomType;
  bVar5 = FixedChargeAdapter::isFixedCharge(&fca);
  if (bVar5) {
    local_150.is_Charge = true;
    local_150.fixedCharge = FixedChargeAdapter::getCharge(&fca);
  }
  ma.at_ = atomType;
  bVar5 = MultipoleAdapter::isMultipole(&ma);
  if (bVar5) {
    bVar5 = MultipoleAdapter::isDipole(&ma);
    if (bVar5) {
      local_150.is_Dipole = true;
      MultipoleAdapter::getDipole((Vector3d *)&eaData2,&ma);
      Vector<double,_3U>::operator=
                (&local_150.dipole.super_Vector<double,_3U>,(Vector<double,_3U> *)&eaData2);
    }
    bVar5 = MultipoleAdapter::isQuadrupole(&ma);
    if (bVar5) {
      local_150.is_Quadrupole = true;
      MultipoleAdapter::getQuadrupole((Mat3x3d *)&eaData2,&ma);
      RectMatrix<double,_3U,_3U>::operator=
                ((RectMatrix<double,_3U,_3U> *)&local_150.quadrupole,
                 (RectMatrix<double,_3U,_3U> *)&eaData2);
    }
  }
  fqa.at_ = atomType;
  bVar5 = FluctuatingChargeAdapter::isFluctuatingCharge(&fqa);
  if (bVar5) {
    local_150.is_Fluctuating = true;
    local_150.uses_SlaterIntramolecular = FluctuatingChargeAdapter::usesSlaterIntramolecular(&fqa);
    local_150.electronegativity = FluctuatingChargeAdapter::getElectronegativity(&fqa);
    local_150.hardness = FluctuatingChargeAdapter::getHardness(&fqa);
    local_150.slaterN = FluctuatingChargeAdapter::getSlaterN(&fqa);
    local_150.slaterZeta = FluctuatingChargeAdapter::getSlaterZeta(&fqa);
  }
  atid = AtomType::getIdent(atomType);
  sVar4 = (this->Etypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  sVar3 = (this->FQtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pVar13 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
           _M_insert_unique<int_const&>
                     ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      &this->Etypes,&atid);
  if (pVar13.second == false) {
    snprintf(painCave.errMsg,2000,"Electrostatic already had a previous entry with ident %d\n",
             (ulong)(uint)atid);
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
  }
  (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[atid] = (int)sVar4;
  std::vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>::
  push_back(&this->ElectrostaticMap,&local_150);
  if (local_150.is_Fluctuating == true) {
    pVar13 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
             _M_insert_unique<int_const&>
                       ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                        &this->FQtypes,&atid);
    if (pVar13.second == false) {
      snprintf(painCave.errMsg,2000,
               "Electrostatic already had a previous fluctuating charge entry with ident %d\n",
               (ulong)(uint)atid);
      painCave.isFatal = 0;
      painCave.severity = 3;
      simError();
    }
    iVar10 = (int)sVar3;
    (this->FQtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[atid] = iVar10;
    lVar11 = (long)iVar10;
    std::
    vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>
    ::resize((this->Jij).
             super__Vector_base<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar11,(long)this->nFlucq_);
    for (p_Var8 = (this->FQtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &(this->FQtypes)._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      lVar7 = (long)(this->FQtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)p_Var8[1]._M_color];
      ElectrostaticAtomData::ElectrostaticAtomData
                (&eaData2,(this->ElectrostaticMap).
                          super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                          (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[(int)p_Var8[1]._M_color]);
      b = eaData2.slaterZeta;
      n = eaData2.slaterN;
      a = local_150.slaterZeta;
      iVar10 = local_150.slaterN;
      std::make_shared<OpenMD::CubicSpline>();
      if ((local_150.uses_SlaterIntramolecular == true) &&
         (eaData2.uses_SlaterIntramolecular == true)) {
        dVar2 = this->cutoffRadius_;
        iVar6 = this->np_;
        iVar1 = iVar6 + -1;
        rvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        rvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        rvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        Jvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        Jvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        Jvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        for (iVar9 = 1; iVar9 <= iVar6; iVar9 = iVar9 + 1) {
          rval = (double)iVar9 * ((dVar2 + 2.0) / (double)iVar1);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)
                     &rvals.super__Vector_base<double,_std::allocator<double>_>,&rval);
          RVar12 = sSTOCoulInt(a,b,iVar10,n,rval * 1.88972612);
          local_1a0 = RVar12 * 627.509469;
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    ((vector<double,_std::allocator<double>_> *)
                     &Jvals.super__Vector_base<double,_std::allocator<double>_>,&local_1a0);
          iVar6 = this->np_;
        }
        CubicSpline::addPoints
                  (J.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (vector<double,_std::allocator<double>_> *)
                   &rvals.super__Vector_base<double,_std::allocator<double>_>,
                   (vector<double,_std::allocator<double>_> *)
                   &Jvals.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&Jvals.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&rvals.super__Vector_base<double,_std::allocator<double>_>);
      }
      std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)
                 (lVar7 * 0x10 +
                 *(long *)&(this->Jij).
                           super__Vector_base<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar11].
                           super__Vector_base<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>
                           ._M_impl.super__Vector_impl_data),
                 &J.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>);
      std::
      vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>
      ::resize((this->Jij).
               super__Vector_base<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar7,(long)this->nFlucq_);
      std::__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2> *)
                 (*(long *)&(this->Jij).
                            super__Vector_base<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar7].
                            super__Vector_base<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>
                            ._M_impl.super__Vector_impl_data + lVar11 * 0x10),
                 &J.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&J.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
  }
  return;
}

Assistant:

void Electrostatic::addType(AtomType* atomType) {
    ElectrostaticAtomData electrostaticAtomData;
    electrostaticAtomData.is_Charge                 = false;
    electrostaticAtomData.is_Dipole                 = false;
    electrostaticAtomData.is_Quadrupole             = false;
    electrostaticAtomData.is_Fluctuating            = false;
    electrostaticAtomData.uses_SlaterIntramolecular = false;

    FixedChargeAdapter fca = FixedChargeAdapter(atomType);

    if (fca.isFixedCharge()) {
      electrostaticAtomData.is_Charge   = true;
      electrostaticAtomData.fixedCharge = fca.getCharge();
    }

    MultipoleAdapter ma = MultipoleAdapter(atomType);
    if (ma.isMultipole()) {
      if (ma.isDipole()) {
        electrostaticAtomData.is_Dipole = true;
        electrostaticAtomData.dipole    = ma.getDipole();
      }
      if (ma.isQuadrupole()) {
        electrostaticAtomData.is_Quadrupole = true;
        electrostaticAtomData.quadrupole    = ma.getQuadrupole();
      }
    }

    FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);

    if (fqa.isFluctuatingCharge()) {
      electrostaticAtomData.is_Fluctuating = true;
      electrostaticAtomData.uses_SlaterIntramolecular =
          fqa.usesSlaterIntramolecular();
      electrostaticAtomData.electronegativity = fqa.getElectronegativity();
      electrostaticAtomData.hardness          = fqa.getHardness();
      electrostaticAtomData.slaterN           = fqa.getSlaterN();
      electrostaticAtomData.slaterZeta        = fqa.getSlaterZeta();
    }

    int atid  = atomType->getIdent();
    int etid  = Etypes.size();
    int fqtid = FQtypes.size();

    pair<set<int>::iterator, bool> ret;
    ret = Etypes.insert(atid);
    if (ret.second == false) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Electrostatic already had a previous entry with ident %d\n",
               atid);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }

    Etids[atid] = etid;
    ElectrostaticMap.push_back(electrostaticAtomData);

    if (electrostaticAtomData.is_Fluctuating) {
      ret = FQtypes.insert(atid);
      if (ret.second == false) {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "Electrostatic already had a previous fluctuating charge entry "
            "with ident %d\n",
            atid);
        painCave.severity = OPENMD_INFO;
        painCave.isFatal  = 0;
        simError();
      }
      FQtids[atid] = fqtid;
      Jij[fqtid].resize(nFlucq_);

      // Now, iterate over all known fluctuating and add to the
      // coulomb integral map:

      std::set<int>::iterator it;
      for (it = FQtypes.begin(); it != FQtypes.end(); ++it) {
        int etid2                     = Etids[(*it)];
        int fqtid2                    = FQtids[(*it)];
        ElectrostaticAtomData eaData2 = ElectrostaticMap[etid2];
        RealType a                    = electrostaticAtomData.slaterZeta;
        RealType b                    = eaData2.slaterZeta;
        int m                         = electrostaticAtomData.slaterN;
        int n                         = eaData2.slaterN;
        CubicSplinePtr J {std::make_shared<CubicSpline>()};

        // do both types actually use Slater orbitals?

        if ((electrostaticAtomData.uses_SlaterIntramolecular &&
             eaData2.uses_SlaterIntramolecular)) {
          // Create the spline of the coulombic integral for s-type
          // Slater orbitals.  Add a 2 angstrom safety window to deal
          // with cutoffGroups that have charged atoms longer than the
          // cutoffRadius away from each other.

          RealType rval;
          RealType dr = (cutoffRadius_ + 2.0) / RealType(np_ - 1);
          vector<RealType> rvals;
          vector<RealType> Jvals;
          // RealType j0, j0c, j1c;
          // don't start at i = 0, as rval = 0 is undefined for the
          // slater overlap integrals.
          for (int i = 1; i < np_ + 1; i++) {
            rval = RealType(i) * dr;
            rvals.push_back(rval);

            Jvals.push_back(
                sSTOCoulInt(a, b, m, n, rval * Constants::angstromToBohr) *
                Constants::hartreeToKcal);
          }

          J->addPoints(rvals, Jvals);
        }
        Jij[fqtid][fqtid2] = J;
        Jij[fqtid2].resize(nFlucq_);
        Jij[fqtid2][fqtid] = J;
      }
    }
    return;
  }